

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptStackWalker.cpp
# Opt level: O3

void __thiscall
Js::InlinedFrameWalker::FinalizeStackValues
          (InlinedFrameWalker *this,Var *args,size_t argCount,bool deepCopy)

{
  ScriptContext *scriptContext;
  JavascriptFunction *pJVar1;
  Var pvVar2;
  size_t sVar3;
  
  pJVar1 = GetFunctionObject(this);
  if (argCount != 0) {
    scriptContext =
         (((((pJVar1->super_DynamicObject).super_RecyclableObject.type.ptr)->javascriptLibrary).ptr)
         ->super_JavascriptLibraryBase).scriptContext.ptr;
    sVar3 = 0;
    do {
      pvVar2 = JavascriptOperators::BoxStackInstance(args[sVar3],scriptContext,false,deepCopy);
      args[sVar3] = pvVar2;
      sVar3 = sVar3 + 1;
    } while (argCount != sVar3);
  }
  return;
}

Assistant:

void InlinedFrameWalker::FinalizeStackValues(__in_ecount(argCount) Js::Var args[], size_t argCount, bool deepCopy) const
    {
        ScriptContext *scriptContext = this->GetFunctionObject()->GetScriptContext();

        for (size_t i = 0; i < argCount; i++)
        {
            args[i] = Js::JavascriptOperators::BoxStackInstance(args[i], scriptContext, false /*allowStackFunction*/, deepCopy);
        }
    }